

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::getSubwordVector(FastText *this,Vector *vec,string *subword)

{
  uint32_t uVar1;
  int32_t iVar2;
  element_type *peVar3;
  element_type *this_00;
  uint uVar4;
  string *in_RDX;
  Dictionary *in_RSI;
  int32_t h;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  Vector::zero((Vector *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x161015);
  uVar1 = Dictionary::hash(in_RSI,in_RDX);
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x161030);
  uVar4 = uVar1 % (uint)peVar3->bucket;
  this_00 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x161059);
  iVar2 = Dictionary::nwords(this_00);
  addInputVector((FastText *)in_RSI,(Vector *)in_RDX,uVar4 + iVar2);
  return;
}

Assistant:

void FastText::getSubwordVector(Vector& vec, const std::string& subword) const {
	vec.zero();
	int32_t h = dict_->hash(subword) % args_->bucket;
	h = h + dict_->nwords();
	addInputVector(vec, h);
}